

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O0

Sfm_Ntk_t * Abc_NtkExtractMfs2(Abc_Ntk_t *pNtk,int iPivot)

{
  char *pSop;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p;
  Vec_Wec_t *p_00;
  Vec_Str_t *p_01;
  Vec_Wrd_t *p_02;
  Abc_Obj_t *pAVar4;
  word Entry;
  Vec_Int_t *pVVar5;
  Abc_Obj_t *pAVar6;
  Sfm_Ntk_t *pSVar7;
  word uTruth;
  int local_58;
  int nObjs;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Int_t *vArray;
  Vec_Wrd_t *vTruths;
  Vec_Str_t *vFixed;
  Vec_Wec_t *vFanins;
  Vec_Ptr_t *vNodes;
  int iPivot_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Abc_NtkAssignIDs2(pNtk);
  iVar1 = Abc_NtkCiNum(pNtk);
  iVar2 = Vec_PtrSize(p);
  iVar3 = Abc_NtkCoNum(pNtk);
  iVar3 = iVar1 + iVar2 + iVar3;
  p_00 = Vec_WecStart(iVar3);
  p_01 = Vec_StrStart(iVar3);
  p_02 = Vec_WrdStart(iVar3);
  for (nObjs = 0; iVar1 = Vec_PtrSize(p), nObjs < iVar1; nObjs = nObjs + 1) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,nObjs);
    pSop = (char *)(pAVar4->field_5).pData;
    iVar1 = Abc_ObjFaninNum(pAVar4);
    Entry = Abc_SopToTruth(pSop,iVar1);
    Vec_WrdWriteEntry(p_02,(pAVar4->field_6).iTemp,Entry);
    if ((Entry != 0) && (Entry != 0xffffffffffffffff)) {
      pVVar5 = Vec_WecEntry(p_00,(pAVar4->field_6).iTemp);
      iVar1 = Abc_ObjFaninNum(pAVar4);
      Vec_IntGrow(pVVar5,iVar1);
      for (local_58 = 0; iVar1 = Abc_ObjFaninNum(pAVar4), local_58 < iVar1; local_58 = local_58 + 1)
      {
        pAVar6 = Abc_ObjFanin(pAVar4,local_58);
        Vec_IntPush(pVVar5,(pAVar6->field_6).iTemp);
      }
    }
  }
  for (nObjs = 0; iVar1 = Abc_NtkCoNum(pNtk), nObjs < iVar1; nObjs = nObjs + 1) {
    pAVar4 = Abc_NtkCo(pNtk,nObjs);
    pVVar5 = Vec_WecEntry(p_00,(pAVar4->field_6).iTemp);
    iVar1 = Abc_ObjFaninNum(pAVar4);
    Vec_IntGrow(pVVar5,iVar1);
    for (local_58 = 0; iVar1 = Abc_ObjFaninNum(pAVar4), local_58 < iVar1; local_58 = local_58 + 1) {
      pAVar6 = Abc_ObjFanin(pAVar4,local_58);
      Vec_IntPush(pVVar5,(pAVar6->field_6).iTemp);
    }
  }
  Vec_PtrFree(p);
  for (nObjs = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), nObjs < iVar1; nObjs = nObjs + 1) {
    pAVar4 = Abc_NtkObj(pNtk,nObjs);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) &&
       (iPivot <= nObjs)) {
      Vec_StrWriteEntry(p_01,(pAVar4->field_6).iTemp,'\x01');
    }
  }
  iVar1 = Abc_NtkCiNum(pNtk);
  iVar2 = Abc_NtkCoNum(pNtk);
  pSVar7 = Sfm_NtkConstruct(p_00,iVar1,iVar2,p_01,(Vec_Str_t *)0x0,p_02);
  return pSVar7;
}

Assistant:

Sfm_Ntk_t * Abc_NtkExtractMfs2( Abc_Ntk_t * pNtk, int iPivot )
{
    Vec_Ptr_t * vNodes;
    Vec_Wec_t * vFanins;
    Vec_Str_t * vFixed;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vArray;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nObjs;
    vNodes  = Abc_NtkAssignIDs2(pNtk);
    nObjs   = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + Abc_NtkCoNum(pNtk);
    vFanins = Vec_WecStart( nObjs );
    vFixed  = Vec_StrStart( nObjs );
    vTruths = Vec_WrdStart( nObjs );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        word uTruth = Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj));
        Vec_WrdWriteEntry( vTruths, pObj->iTemp, uTruth );
        if ( uTruth == 0 || ~uTruth == 0 )
            continue;
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Vec_PtrFree( vNodes );
    // set fixed attributes
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( i >= iPivot )
            Vec_StrWriteEntry( vFixed, pObj->iTemp, (char)1 );
    return Sfm_NtkConstruct( vFanins, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), vFixed, NULL, vTruths );
}